

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O3

bool __thiscall google::protobuf::safe_strtou64(protobuf *this,StringPiece str,uint64 *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  if (this == (protobuf *)0x0) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,this,str.ptr_ + (long)this);
  }
  bVar2 = safe_strtou64(&local_38,(uint64 *)str.length_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

inline bool safe_strtou64(StringPiece str, uint64* value) {
  return safe_strtou64(str.ToString(), value);
}